

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_RelWord(Expression *expr,uint32_t pcShift)

{
  bool bVar1;
  uint16_t b;
  
  bVar1 = checkcodesection();
  if (bVar1) {
    bVar1 = reserveSpace(2);
    if (bVar1) {
      if (expr->isKnown == false) {
        out_CreatePatch(1,expr,loadOffset + curOffset,pcShift);
        b = 0;
      }
      else {
        b = (uint16_t)expr->val;
      }
      writeword(b);
      rpn_Free(expr);
      return;
    }
  }
  return;
}

Assistant:

void sect_RelWord(struct Expression *expr, uint32_t pcShift)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(2))
		return;

	if (!rpn_isKnown(expr)) {
		createPatch(PATCHTYPE_WORD, expr, pcShift);
		writeword(0);
	} else {
		writeword(expr->val);
	}
	rpn_Free(expr);
}